

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

bool __thiscall NJamSpell::TLangModel::Dump(TLangModel *this,string *modelFileName)

{
  byte bVar1;
  bool bVar2;
  ostream local_220 [8];
  ofstream out;
  string *modelFileName_local;
  TLangModel *this_local;
  
  std::ofstream::ofstream(local_220,(string *)modelFileName,_S_bin);
  bVar1 = std::ofstream::is_open();
  bVar2 = (bVar1 & 1) != 0;
  if (bVar2) {
    NHandyPack::Dump<unsigned_long>(local_220,&LANG_MODEL_MAGIC_BYTE);
    NHandyPack::Dump<unsigned_short>(local_220,&LANG_MODEL_VERSION);
    (**this->_vptr_TLangModel)(this,local_220);
    NHandyPack::Dump<unsigned_long>(local_220,&LANG_MODEL_MAGIC_BYTE);
  }
  std::ofstream::~ofstream(local_220);
  return bVar2;
}

Assistant:

bool TLangModel::Dump(const std::string& modelFileName) const {
    std::ofstream out(modelFileName, std::ios::binary);
    if (!out.is_open()) {
        return false;
    }
    NHandyPack::Dump(out, LANG_MODEL_MAGIC_BYTE);
    NHandyPack::Dump(out, LANG_MODEL_VERSION);
    Dump(out);
    NHandyPack::Dump(out, LANG_MODEL_MAGIC_BYTE);
    return true;
}